

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O3

Ivy_Man_t * Abc_NtkIvyBefore(Abc_Ntk_t *pNtk,int fSeq,int fUseDc)

{
  int *pInits;
  int iVar1;
  uint uVar2;
  Ivy_Man_t *p;
  Vec_Int_t *__ptr;
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                  ,0x5b,"Ivy_Man_t *Abc_NtkIvyBefore(Abc_Ntk_t *, int, int)");
  }
  if (((pNtk->ntkType == ABC_NTK_LOGIC) && (pNtk->ntkFunc == ABC_FUNC_BDD)) &&
     (iVar1 = Abc_NtkBddToSop(pNtk,-1,1000000000), iVar1 == 0)) {
    puts("Abc_NtkIvyBefore(): Converting to SOPs has failed.");
  }
  else {
    if ((fSeq != 0) && (iVar1 = Abc_NtkCountSelfFeedLatches(pNtk), iVar1 != 0)) {
      uVar2 = Abc_NtkCountSelfFeedLatches(pNtk);
      printf("Warning: The network has %d self-feeding latches.\n",(ulong)uVar2);
    }
    iVar1 = Abc_NtkGetChoiceNum(pNtk);
    if (iVar1 != 0) {
      puts("Warning: The choice nodes in the initial AIG are removed by strashing.");
    }
    p = Abc_NtkToIvy(pNtk);
    iVar1 = Ivy_ManCheck(p);
    if (iVar1 != 0) {
      if (fSeq == 0) {
        return p;
      }
      iVar1 = pNtk->nObjCounts[8];
      __ptr = Abc_NtkCollectLatchValuesIvy(pNtk,fUseDc);
      pInits = __ptr->pArray;
      Ivy_ManMakeSeq(p,iVar1,pInits);
      if (pInits != (int *)0x0) {
        free(pInits);
      }
      free(__ptr);
      return p;
    }
    puts("AIG check has failed.");
    Ivy_ManStop(p);
  }
  return (Ivy_Man_t *)0x0;
}

Assistant:

Ivy_Man_t * Abc_NtkIvyBefore( Abc_Ntk_t * pNtk, int fSeq, int fUseDc )
{
    Ivy_Man_t * pMan;
//timeRetime = Abc_Clock();
    assert( !Abc_NtkIsNetlist(pNtk) );
    if ( Abc_NtkIsBddLogic(pNtk) )
    {
        if ( !Abc_NtkBddToSop(pNtk, -1, ABC_INFINITY) )
        {
            printf( "Abc_NtkIvyBefore(): Converting to SOPs has failed.\n" );
            return NULL;
        }
    }
    if ( fSeq && Abc_NtkCountSelfFeedLatches(pNtk) )
    {
        printf( "Warning: The network has %d self-feeding latches.\n", Abc_NtkCountSelfFeedLatches(pNtk) );
//        return NULL;
    }
    // print warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Warning: The choice nodes in the initial AIG are removed by strashing.\n" );
    // convert to the AIG manager
    pMan = Abc_NtkToIvy( pNtk );
    if ( !Ivy_ManCheck( pMan ) )
    {
        printf( "AIG check has failed.\n" );
        Ivy_ManStop( pMan );
        return NULL;
    }
//    Ivy_ManPrintStats( pMan );
    if ( fSeq )
    {
        int nLatches = Abc_NtkLatchNum(pNtk);
        Vec_Int_t * vInit = Abc_NtkCollectLatchValuesIvy( pNtk, fUseDc );
        Ivy_ManMakeSeq( pMan, nLatches, vInit->pArray );
        Vec_IntFree( vInit );
//        Ivy_ManPrintStats( pMan );
    }
//timeRetime = Abc_Clock() - timeRetime;
    return pMan;
}